

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> * __thiscall
tinyusdz::lerp<std::array<double,4ul>>
          (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *a,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *b,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  pointer paVar8;
  pointer paVar9;
  ulong uVar10;
  long lVar11;
  ulong __new_size;
  double dVar12;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = *(long *)(this + 8) - *(long *)this >> 5;
  __new_size = (long)(a->
                     super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar10 <= __new_size) {
    __new_size = uVar10;
  }
  if (__new_size != 0) {
    ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      dVar12 = 1.0 - t;
      lVar11 = 0x18;
      do {
        lVar7 = *(long *)this;
        paVar8 = (a->
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dVar1 = *(double *)(lVar7 + -0x10 + lVar11);
        dVar2 = *(double *)(lVar7 + -8 + lVar11);
        dVar3 = *(double *)(lVar7 + lVar11);
        dVar4 = *(double *)((long)paVar8->_M_elems + lVar11 + -0x10);
        dVar5 = *(double *)((long)paVar8->_M_elems + lVar11 + -8);
        dVar6 = *(double *)((long)paVar8->_M_elems + lVar11);
        paVar9 = (__return_storage_ptr__->
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)paVar9->_M_elems + lVar11 + -0x18) =
             *(double *)((long)paVar8->_M_elems + lVar11 + -0x18) * t +
             *(double *)(lVar7 + -0x18 + lVar11) * dVar12;
        *(double *)((long)paVar9->_M_elems + lVar11 + -0x10) = dVar4 * t + dVar1 * dVar12;
        *(double *)((long)paVar9->_M_elems + lVar11 + -8) = dVar5 * t + dVar2 * dVar12;
        *(double *)((long)paVar9->_M_elems + lVar11) = dVar6 * t + dVar3 * dVar12;
        lVar11 = lVar11 + 0x20;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}